

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall TestMaterial::RandomTestSupportFunctionAllObjects(TestMaterial *this)

{
  undefined8 *puVar1;
  long *plVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  time_t tVar13;
  void *__s;
  clock_t cVar14;
  long lVar15;
  clock_t cVar16;
  ostream *poVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  long local_80;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomTestSupportFunctionAllObjects",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&local_60,((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8) >> 3) * 1000000,
         (allocator_type *)&local_48);
  tVar13 = time((time_t *)0x0);
  srand((uint)tVar13);
  __s = operator_new(24000000);
  memset(__s,0,24000000);
  lVar19 = 0x10;
  do {
    iVar9 = rand();
    iVar10 = rand();
    iVar11 = rand();
    iVar12 = rand();
    dVar3 = log((double)iVar9 / 2147483647.0);
    dVar3 = dVar3 * -2.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar4 = cos(((double)iVar10 / 2147483647.0) * 6.283185307179586);
    dVar5 = log((double)iVar10 / 2147483647.0);
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = cos(((double)iVar9 / 2147483647.0) * 6.283185307179586);
    dVar7 = log((double)iVar11 / 2147483647.0);
    dVar7 = dVar7 * -2.0;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar8 = cos(((double)iVar12 / 2147483647.0) * 6.283185307179586);
    *(double *)((long)__s + lVar19 + -0x10) = dVar3 * dVar4;
    *(double *)((long)__s + lVar19 + -8) = dVar5 * dVar6;
    *(double *)((long)__s + lVar19) = dVar8 * dVar7;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x16e3610);
  lVar19 = 0;
  cVar14 = clock();
  local_80 = 0;
  do {
    lVar15 = *(long *)&this->field_0x8;
    if (*(long *)&this->field_0x10 != lVar15) {
      lVar18 = 0;
      uVar20 = 0;
      do {
        plVar2 = *(long **)(lVar15 + uVar20 * 8);
        (**(code **)(*plVar2 + 0x20))(&local_48,plVar2,(void *)((long)__s + local_80 * 0x18));
        lVar15 = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) * lVar19;
        *(undefined8 *)
         ((long)&(local_60.
                  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_z + lVar18 + lVar15) = local_38;
        puVar1 = (undefined8 *)
                 ((long)&(local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar18 + lVar15);
        *puVar1 = local_48;
        puVar1[1] = uStack_40;
        uVar20 = uVar20 + 1;
        lVar15 = *(long *)&this->field_0x8;
        lVar18 = lVar18 + 0x18;
      } while (uVar20 < (ulong)(*(long *)&this->field_0x10 - lVar15 >> 3));
    }
    local_80 = local_80 + 1;
    lVar19 = lVar19 + 0x18;
  } while (local_80 != 1000000);
  cVar16 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)(cVar16 - cVar14) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  operator_delete(__s,24000000);
  if (local_60.
      super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunctionAllObjects()
{
  std::cout << "RandomTestSupportFunctionAllObjects" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd * sObj.size());

  srand(static_cast<unsigned int>(time(NULL)));
  clock_t begin, end;

  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {
    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();
  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    for(size_t i=0; i<sObj.size(); i++)
      supportVector[j*sObj.size() + i] = sObj[i]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

#ifdef DO_TEST
# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupportall_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for(size_t i=0; i<supportVector.size(); ++i)
    outfile << supportVector[i] << std::endl;
  outfile.close();
# endif
#endif
}